

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

bool __thiscall QMetaType::load(QMetaType *this,QDataStream *stream,void *data)

{
  QMetaTypeInterface *pQVar1;
  DataStreamInFn p_Var2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((data == (void *)0x0) || (pQVar1 = this->d_ptr, pQVar1 == (QMetaTypeInterface *)0x0)) {
LAB_0029707a:
    bVar3 = false;
    goto LAB_0029707c;
  }
  iVar4 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
  if (iVar4 == 0) {
    iVar4 = registerHelper(pQVar1);
  }
  if (iVar4 == 0x20) {
LAB_0029703f:
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(stream,(qint64 *)&local_28);
    *(undefined1 **)data = local_28;
  }
  else {
    pQVar1 = this->d_ptr;
    if (pQVar1 == (QMetaTypeInterface *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
      if (iVar4 == 0) {
        iVar4 = registerHelper(pQVar1);
      }
    }
    if (iVar4 == 0x23) goto LAB_0029703f;
    p_Var2 = this->d_ptr->dataStreamIn;
    if (p_Var2 == (DataStreamInFn)0x0) goto LAB_0029707a;
    (*p_Var2)(this->d_ptr,stream,data);
  }
  bVar3 = true;
LAB_0029707c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::load(QDataStream &stream, void *data) const
{
    if (!data || !isValid())
        return false;

    // keep compatibility for long/ulong
    if (id() == QMetaType::Long) {
        qlonglong ll;
        stream >> ll;
        *(long *)data = long(ll);
        return true;
    } else if (id() == QMetaType::ULong) {
        qulonglong ull;
        stream >> ull;
        *(unsigned long *)data = (unsigned long)(ull);
        return true;
    }
    if (!d_ptr->dataStreamIn)
        return false;

    d_ptr->dataStreamIn(d_ptr, stream, data);
    return true;
}